

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

uncertain_measurement
units::uncertain_measurement_from_string(string *measurement_string,uint64_t match_flags)

{
  undefined1 uVar1;
  bool bVar2;
  ulong uVar3;
  const_iterator ppcVar4;
  long lVar5;
  char *pcVar6;
  undefined1 *puVar7;
  double uncertainty_val;
  double dVar8;
  measurement mVar9;
  string local_228;
  measurement local_208;
  string local_1f8;
  undefined1 local_1d8 [8];
  measurement u1;
  undefined1 local_1a8 [8];
  measurement m1_1;
  string p;
  string ustring;
  ulong uStack_150;
  char c;
  size_type lc;
  int cloc;
  size_type diff;
  size_type eloc;
  size_type loc;
  undefined4 local_11c;
  unit local_118;
  unit local_110;
  unit local_108;
  string local_100;
  undefined1 local_e0 [8];
  measurement m2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p2;
  string local_a0;
  undefined1 local_80 [8];
  measurement m1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p1;
  size_type loc_1;
  char *pmseq;
  const_iterator __end1;
  const_iterator __begin1;
  array<const_char_*,_9UL> *__range1;
  uint64_t match_flags_local;
  string *measurement_string_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    __end1 = std::array<const_char_*,_9UL>::begin(&uncertain_measurement_from_string::pmsequences);
    ppcVar4 = std::array<const_char_*,_9UL>::end(&uncertain_measurement_from_string::pmsequences);
    for (; __end1 != ppcVar4; __end1 = __end1 + 1) {
      pcVar6 = *__end1;
      lVar5 = std::__cxx11::string::find((char *)measurement_string,(ulong)pcVar6);
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)&m1.units_,(ulong)measurement_string);
        std::__cxx11::string::string((string *)&local_a0,(string *)&m1.units_);
        mVar9 = measurement_cast_from_string(&local_a0,match_flags);
        m1.value_ = (double)mVar9.units_;
        local_80 = (undefined1  [8])mVar9.value_;
        std::__cxx11::string::~string((string *)&local_a0);
        strlen(pcVar6);
        std::__cxx11::string::substr((ulong)&m2.units_,(ulong)measurement_string);
        std::__cxx11::string::string((string *)&local_100,(string *)&m2.units_);
        mVar9 = measurement_cast_from_string(&local_100,match_flags);
        m2.value_ = (double)mVar9.units_;
        local_e0 = (undefined1  [8])mVar9.value_;
        std::__cxx11::string::~string((string *)&local_100);
        local_108 = measurement::units((measurement *)local_80);
        bVar2 = unit::operator==(&local_108,(unit *)&one);
        if (bVar2) {
          dVar8 = measurement::value((measurement *)local_80);
          uncertainty_val = measurement::value((measurement *)local_e0);
          local_118 = measurement::units((measurement *)local_e0);
          local_110 = unit_cast(&local_118);
          uncertain_measurement::uncertain_measurement
                    ((uncertain_measurement *)&measurement_string_local,dVar8,uncertainty_val,
                     &local_110);
        }
        else {
          register0x00000000 = measurement::units((measurement *)local_e0);
          bVar2 = unit::operator==((unit *)((long)&loc + 4),(unit *)&one);
          if (bVar2) {
            dVar8 = measurement::value((measurement *)local_e0);
            uncertain_measurement::uncertain_measurement
                      ((uncertain_measurement *)&measurement_string_local,(measurement *)local_80,
                       dVar8);
          }
          else {
            uncertain_measurement::uncertain_measurement
                      ((uncertain_measurement *)&measurement_string_local,(measurement *)local_80,
                       (measurement *)local_e0);
          }
        }
        local_11c = 1;
        std::__cxx11::string::~string((string *)&m2.units_);
        std::__cxx11::string::~string((string *)&m1.units_);
        return _measurement_string_local;
      }
    }
    uVar3 = std::__cxx11::string::find_first_of((char)measurement_string,0x28);
    if ((uVar3 != 0xffffffffffffffff) && (1 < uVar3)) {
      lVar5 = std::__cxx11::string::find_first_of((char)measurement_string,0x29);
      if ((1 < lVar5 - uVar3) && (lVar5 - uVar3 < 5)) {
        lc._4_4_ = (int)uVar3;
        uStack_150 = lVar5 - 1;
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)measurement_string);
        if (('/' < *pcVar6) && (*pcVar6 < ':')) {
          std::__cxx11::string::string
                    ((string *)(p.field_2._M_local_buf + 8),(string *)measurement_string);
          while (lc._4_4_ = lc._4_4_ + -1, -1 < lc._4_4_) {
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)measurement_string);
            if (('/' < *pcVar6) && (*pcVar6 < ':')) {
              if (uVar3 < uStack_150) {
                puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)measurement_string);
                uVar1 = *puVar7;
                puVar7 = (undefined1 *)
                         std::__cxx11::string::operator[]((ulong)((long)&p.field_2 + 8));
                *puVar7 = uVar1;
                uStack_150 = uStack_150 - 1;
              }
              else {
                puVar7 = (undefined1 *)
                         std::__cxx11::string::operator[]((ulong)((long)&p.field_2 + 8));
                *puVar7 = 0x30;
              }
            }
          }
          std::__cxx11::string::string((string *)&m1_1.units_,(string *)measurement_string);
          std::__cxx11::string::erase((ulong)&m1_1.units_,uVar3);
          std::__cxx11::string::string((string *)&u1.units_,(string *)&m1_1.units_);
          mVar9 = measurement_cast_from_string((string *)&u1.units_,match_flags);
          m1_1.value_ = (double)mVar9.units_;
          local_1a8 = (undefined1  [8])mVar9.value_;
          std::__cxx11::string::~string((string *)&u1.units_);
          std::__cxx11::string::erase((ulong)((long)&p.field_2 + 8),uVar3);
          std::__cxx11::string::string((string *)&local_1f8,(string *)(p.field_2._M_local_buf + 8));
          mVar9 = measurement_cast_from_string(&local_1f8,match_flags);
          u1.value_ = (double)mVar9.units_;
          local_1d8 = (undefined1  [8])mVar9.value_;
          std::__cxx11::string::~string((string *)&local_1f8);
          uncertain_measurement::uncertain_measurement
                    ((uncertain_measurement *)&measurement_string_local,(measurement *)local_1a8,
                     (measurement *)local_1d8);
          local_11c = 1;
          std::__cxx11::string::~string((string *)&m1_1.units_);
          std::__cxx11::string::~string((string *)(p.field_2._M_local_buf + 8));
          return _measurement_string_local;
        }
      }
    }
    std::__cxx11::string::string((string *)&local_228,(string *)measurement_string);
    local_208 = measurement_cast_from_string(&local_228,match_flags);
    uncertain_measurement::uncertain_measurement
              ((uncertain_measurement *)&measurement_string_local,&local_208,0.0);
    std::__cxx11::string::~string((string *)&local_228);
  }
  else {
    memset(&measurement_string_local,0,0x10);
    uncertain_measurement::uncertain_measurement((uncertain_measurement *)&measurement_string_local)
    ;
  }
  return _measurement_string_local;
}

Assistant:

uncertain_measurement uncertain_measurement_from_string(
    const std::string& measurement_string,
    std::uint64_t match_flags)
{
    if (measurement_string.empty()) {
        return {};
    }
    // first task is to find the +/-
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<const char*, 9> pmsequences{
        {"+/-",
         "\xB1",
         u8"\u00B1",
         "&plusmn;",
         "+-",
         "<u>+</u>",
         "&#xB1;",
         "&pm;",
         " \\pm "}};

    for (const auto* pmseq : pmsequences) {
        auto loc = measurement_string.find(pmseq);
        if (loc != std::string::npos) {
            auto p1 = measurement_string.substr(0, loc);
            auto m1 = measurement_cast_from_string(p1, match_flags);
            auto p2 = measurement_string.substr(loc + strlen(pmseq));
            auto m2 = measurement_cast_from_string(p2, match_flags);
            if (m1.units() == one) {
                return uncertain_measurement(
                    m1.value(), m2.value(), unit_cast(m2.units()));
            }
            if (m2.units() == one) {
                return uncertain_measurement(m1, m2.value());
            }
            return uncertain_measurement(m1, m2);
        }
    }
    // check for consise form of uncertainty X.XXXXXX(UU) N
    auto loc = measurement_string.find_first_of('(');
    if (loc < std::string::npos && loc > 1) {
        auto eloc = measurement_string.find_first_of(')', loc + 1);
        auto diff = eloc - loc;
        if (diff >= 2 && diff <= 4) {
            int cloc = static_cast<int>(loc) - 1;
            auto lc = eloc - 1;
            char c = measurement_string[cloc];
            if (c >= '0' && c <= '9') {
                std::string ustring = measurement_string;
                while (cloc >= 0) {
                    c = measurement_string[cloc];
                    if (c >= '0' && c <= '9') {
                        if (lc > loc) {
                            ustring[cloc] = measurement_string[lc];
                            --lc;
                        } else {
                            ustring[cloc] = '0';
                        }
                    }
                    --cloc;
                }
                std::string p = measurement_string;
                p.erase(loc, diff + 1);
                auto m1 = measurement_cast_from_string(p, match_flags);
                ustring.erase(loc, diff + 1);
                auto u1 = measurement_cast_from_string(ustring, match_flags);
                return uncertain_measurement(m1, u1);
            }
        }
    }
    return uncertain_measurement(
        measurement_cast_from_string(measurement_string, match_flags), 0.0F);
}